

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

float * stbi_loadf_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  float *pfVar2;
  stbi_uc *data;
  
  iVar1 = stbi_hdr_test_memory(buffer,len);
  if (iVar1 != 0) {
    pfVar2 = stbi_hdr_load_from_memory(buffer,len,x,y,comp,req_comp);
    return pfVar2;
  }
  data = stbi_load_from_memory(buffer,len,x,y,comp,req_comp);
  if (data != (stbi_uc *)0x0) {
    if (req_comp == 0) {
      req_comp = *comp;
    }
    pfVar2 = ldr_to_hdr(data,*x,*y,req_comp);
    return pfVar2;
  }
  failure_reason = "Image not of any known type, or corrupt";
  return (float *)0x0;
}

Assistant:

float *stbi_loadf_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   stbi_uc *data;
   #ifndef STBI_NO_HDR
   if (stbi_hdr_test_memory(buffer, len))
      return stbi_hdr_load_from_memory(buffer, len,x,y,comp,req_comp);
   #endif
   data = stbi_load_from_memory(buffer, len, x, y, comp, req_comp);
   if (data)
      return ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return epf("unknown image type", "Image not of any known type, or corrupt");
}